

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.h
# Opt level: O2

ON_3dmPageSettings * __thiscall
ON_3dmPageSettings::operator=(ON_3dmPageSettings *this,ON_3dmPageSettings *param_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  undefined4 uVar6;
  
  this->m_bottom_margin_mm = param_1->m_bottom_margin_mm;
  iVar5 = param_1->m_page_number;
  uVar6 = *(undefined4 *)&param_1->field_0x4;
  dVar1 = param_1->m_width_mm;
  dVar2 = param_1->m_height_mm;
  dVar3 = param_1->m_left_margin_mm;
  dVar4 = param_1->m_top_margin_mm;
  this->m_right_margin_mm = param_1->m_right_margin_mm;
  this->m_top_margin_mm = dVar4;
  this->m_height_mm = dVar2;
  this->m_left_margin_mm = dVar3;
  this->m_page_number = iVar5;
  *(undefined4 *)&this->field_0x4 = uVar6;
  this->m_width_mm = dVar1;
  ON_wString::operator=(&this->m_printer_name,&param_1->m_printer_name);
  return this;
}

Assistant:

class ON_CLASS ON_3dmPageSettings
{
public:
  ON_3dmPageSettings();
  ~ON_3dmPageSettings();

  bool IsValid( ON_TextLog* text_log = 0 ) const;

  void Default();

  int m_page_number;

  // Overall size of the page in millimeters
  double m_width_mm;
  double m_height_mm;

  // Page margins in millimeters
  double m_left_margin_mm;
  double m_right_margin_mm;
  double m_top_margin_mm;
  double m_bottom_margin_mm;

  ON_wString m_printer_name;

  bool Write(ON_BinaryArchive& archive) const;
  bool Read(ON_BinaryArchive& archive);
}